

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar5;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_4;
  Mat borderm_1;
  int z;
  __m128 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  __m128 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m128 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m128 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_3;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_5;
  Mat *m_2;
  undefined8 in_stack_fffffffffffff490;
  size_t in_stack_fffffffffffff498;
  Mat *pMVar6;
  int in_stack_fffffffffffff4a0;
  int in_stack_fffffffffffff4a4;
  int in_stack_fffffffffffff4a8;
  int in_stack_fffffffffffff4ac;
  undefined4 in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b4;
  Option *in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4c0;
  int in_stack_fffffffffffff4c4;
  int in_stack_fffffffffffff510;
  Allocator *in_stack_fffffffffffff518;
  Allocator *in_stack_fffffffffffff520;
  undefined8 in_stack_fffffffffffff550;
  undefined8 in_stack_fffffffffffff558;
  undefined8 uVar7;
  Mat *in_stack_fffffffffffff560;
  undefined8 uVar8;
  Mat *in_stack_fffffffffffff568;
  undefined8 local_a38;
  undefined8 uStack_a30;
  int local_9c4;
  Mat local_958;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined4 local_8f8;
  Allocator *local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined8 local_8d0;
  Mat local_8c8;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_868;
  Allocator *local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined8 local_840;
  Mat local_838;
  int local_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  int local_7d0;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  void *local_7c0;
  int *local_7b8;
  size_t local_7b0;
  int local_7a8;
  Allocator *local_7a0;
  int in_stack_fffffffffffff868;
  int in_stack_fffffffffffff86c;
  Mat *in_stack_fffffffffffff870;
  Mat *in_stack_fffffffffffff878;
  Padding *in_stack_fffffffffffff880;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  Mat local_750;
  int local_708;
  int local_704;
  long local_700;
  int local_6f8;
  int local_6f4;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  Mat *in_stack_fffffffffffff918;
  Mat *in_stack_fffffffffffff920;
  Padding_x86 *in_stack_fffffffffffff928;
  float local_6b8 [2];
  float afStack_6b0 [2];
  long local_6a8;
  int local_69c;
  int local_698;
  int local_694;
  ulong local_690;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  Mat *local_668;
  Mat *local_660;
  int local_64c;
  int local_648;
  undefined4 local_644;
  Mat *local_640;
  Mat *local_620;
  Mat *local_618;
  Mat *local_610;
  Mat *local_608;
  Mat *local_600;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 local_5e8;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_588;
  undefined1 uStack_57d;
  int iStack_57c;
  undefined8 *local_570;
  undefined1 local_565;
  int local_564;
  Mat *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  long *local_540;
  long *local_538;
  int local_52c;
  float *local_528;
  int local_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  Mat *local_508;
  int local_4fc;
  undefined8 *local_4f8;
  int local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  Mat *local_4d0;
  undefined1 local_4c5;
  int local_4c4;
  undefined8 *local_4b8;
  undefined1 local_4ad;
  int local_4ac;
  void **local_4a0;
  void **local_478;
  Mat *local_468;
  undefined8 *local_458;
  undefined8 *local_448;
  Mat *local_438;
  Mat *local_428;
  Mat *local_418;
  int local_404;
  undefined8 *local_400;
  Mat *local_3f8;
  int local_3ec;
  undefined8 *local_3e8;
  Mat *local_3e0;
  Mat *local_3d0;
  int local_3b8;
  undefined4 local_3b4;
  Mat *local_3b0;
  int local_398;
  undefined4 local_394;
  Mat *local_390;
  int local_378;
  undefined4 local_374;
  Mat *local_370;
  undefined8 *local_350;
  undefined8 *local_330;
  int local_318;
  undefined4 local_314;
  Mat *local_310;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2a8;
  undefined4 local_2a4;
  void *local_298;
  void *local_270;
  undefined8 *local_260;
  void *local_230;
  float *local_220;
  void *local_210;
  Mat *local_200;
  Mat *local_1f8;
  Mat *local_1f0;
  Mat *local_1e8;
  Mat *local_1e0;
  Mat *local_1d8;
  Mat *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  void **local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  ulong local_148;
  undefined8 *local_140;
  int local_134;
  int local_130;
  int local_12c;
  Mat *local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float *local_78;
  Allocator *local_70;
  int local_64;
  size_t local_60;
  void *local_58;
  int local_50;
  int local_4c;
  Mat *local_48;
  Allocator *local_40;
  int local_34;
  size_t local_30;
  float *local_28;
  int local_20;
  int local_1c;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  if (((((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) == 0)) &&
       (*(int *)(in_RDI + 0xd8) == 0)) &&
      ((*(int *)(in_RDI + 0xdc) == 0 && (*(int *)(in_RDI + 0xe8) == 0)))) &&
     (*(int *)(in_RDI + 0xec) == 0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        piVar1 = in_RSI->refcount;
        local_644 = 1;
        LOCK();
        local_648 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_640 = in_RSI;
      if (in_RDX->refcount != (int *)0x0) {
        piVar1 = in_RDX->refcount;
        local_2a4 = 0xffffffff;
        LOCK();
        local_2a8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_2a8 == 1) {
          if (in_RDX->allocator == (Allocator *)0x0) {
            local_298 = in_RDX->data;
            if (local_298 != (void *)0x0) {
              free(local_298);
            }
          }
          else {
            (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
          }
        }
      }
      in_RDX->data = (void *)0x0;
      in_RDX->elemsize = 0;
      in_RDX->elempack = 0;
      in_RDX->dims = 0;
      in_RDX->w = 0;
      in_RDX->h = 0;
      in_RDX->d = 0;
      in_RDX->c = 0;
      in_RDX->cstep = 0;
      in_RDX->refcount = (int *)0x0;
      in_RDX->data = local_640->data;
      in_RDX->refcount = local_640->refcount;
      in_RDX->elemsize = local_640->elemsize;
      in_RDX->elempack = local_640->elempack;
      in_RDX->allocator = local_640->allocator;
      in_RDX->dims = local_640->dims;
      in_RDX->w = local_640->w;
      in_RDX->h = local_640->h;
      in_RDX->d = local_640->d;
      in_RDX->c = local_640->c;
      in_RDX->cstep = local_640->cstep;
    }
    return 0;
  }
  if (in_RSI->elempack == 0) {
    local_9c4 = 0;
  }
  else {
    uVar4 = in_RSI->elemsize << 3;
    local_9c4 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                     (long)in_RSI->elempack);
  }
  local_674 = local_9c4;
  if (local_9c4 == 8) {
    iVar2 = forward_int8(in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                         in_stack_fffffffffffff918,
                         (Option *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    return iVar2;
  }
  local_678 = in_RSI->w;
  local_67c = in_RSI->h;
  local_680 = in_RSI->d;
  local_684 = in_RSI->c;
  local_688 = in_RSI->dims;
  local_690 = in_RSI->elemsize;
  local_694 = in_RSI->elempack;
  if (local_694 == 4) {
    iVar2 = (int)((ulong)in_stack_fffffffffffff4b8 >> 0x20);
    local_668 = in_RDX;
    local_660 = in_RSI;
    if (local_688 == 1) {
      local_698 = local_678 * 4 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_69c = 1;
      if (local_698 % 4 == 0) {
        local_69c = 4;
      }
      local_6a8 = (local_690 / 4) * (long)local_69c;
      if (((*(int *)(in_RDI + 0xd8) % 4 == 0) && (local_69c == 4)) && (*(int *)(in_RDI + 0xe0) == 0)
         ) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),iVar2,
                    CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                    in_stack_fffffffffffff4ac,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
        local_600 = local_668;
        bVar5 = true;
        if (local_668->data != (void *)0x0) {
          local_1f0 = local_668;
          bVar5 = local_668->cstep * (long)local_668->c == 0;
        }
        if (!bVar5) {
          local_598 = *(float *)(in_RDI + 0xe4);
          local_6b8[1] = local_598;
          local_6b8[0] = local_598;
          afStack_6b0[1] = local_598;
          afStack_6b0[0] = local_598;
          fStack_594 = local_598;
          fStack_590 = local_598;
          fStack_58c = local_598;
          local_588 = local_598;
          padding_constant_pack4_sse
                    (local_660,local_668,0,0,*(int *)(in_RDI + 0xd8) / 4,*(int *)(in_RDI + 0xdc) / 4
                     ,(__m128 *)local_6b8);
          return 0;
        }
        return -100;
      }
    }
    if (local_688 == 2) {
      iVar3 = 1;
      if ((local_67c * 4 + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4)) % 4 == 0) {
        iVar3 = 4;
      }
      if (((*(int *)(in_RDI + 0xd0) % 4 == 0) && (iVar3 == 4)) && (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),iVar2,
                    (int)in_stack_fffffffffffff4b8,
                    CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                    in_stack_fffffffffffff4ac,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
        local_608 = local_668;
        bVar5 = true;
        if (local_668->data != (void *)0x0) {
          local_1e8 = local_668;
          bVar5 = local_668->cstep * (long)local_668->c == 0;
        }
        if (!bVar5) {
          local_5b8 = *(undefined4 *)(in_RDI + 0xe4);
          uStack_5b4 = local_5b8;
          uStack_5b0 = local_5b8;
          uStack_5ac = local_5b8;
          local_5a8 = local_5b8;
          padding_constant_pack4_sse
                    (local_660,local_668,*(int *)(in_RDI + 0xd0) / 4,*(int *)(in_RDI + 0xd4) / 4,
                     *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),
                     (__m128 *)&stack0xfffffffffffff918);
          return 0;
        }
        return -100;
      }
    }
    if (local_688 == 3) {
      local_6f4 = local_684 * 4 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      local_6f8 = 1;
      if (local_6f4 % 4 == 0) {
        local_6f8 = 4;
      }
      local_700 = (local_690 / 4) * (long)local_6f8;
      if (((*(int *)(in_RDI + 0xe8) % 4 == 0) && (local_6f8 == 4)) &&
         ((local_6f4 == local_684 * 4 || (*(int *)(in_RDI + 0xe0) == 0)))) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),iVar2,
                    (int)in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b4,
                    CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                    in_stack_fffffffffffff4a4,in_stack_fffffffffffff520);
        local_610 = local_668;
        bVar5 = true;
        if (local_668->data != (void *)0x0) {
          local_1e0 = local_668;
          bVar5 = local_668->cstep * (long)local_668->c == 0;
        }
        if (!bVar5) {
          local_704 = *(int *)(in_RDI + 0xe8) / local_694;
          for (local_708 = 0; local_708 < local_6f4 / local_6f8; local_708 = local_708 + 1) {
            local_558 = &local_750;
            local_12c = local_668->w;
            local_130 = local_668->h;
            local_134 = local_668->d;
            local_140 = (undefined8 *)
                        ((long)local_668->data +
                        local_668->cstep * (long)local_708 * local_668->elemsize);
            local_148 = local_668->elemsize;
            local_14c = local_668->elempack;
            local_158 = local_668->allocator;
            local_128 = &local_750;
            local_750.refcount = (int *)0x0;
            local_750.d = 1;
            local_d0 = (long)local_12c * (long)local_130 * local_148;
            local_750.cstep = (local_d0 + 0xfU & 0xfffffffffffffff0) / local_148;
            local_750.dims = local_668->dims + -1;
            if (local_668->dims == 4) {
              local_750.cstep = (long)local_668->w * (long)local_668->h;
            }
            local_d4 = 0x10;
            local_564 = local_708;
            local_565 = 1;
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_5d8 = *(undefined4 *)(in_RDI + 0xe4);
              local_a38 = CONCAT44(local_5d8,local_5d8);
              uStack_a30 = CONCAT44(local_5d8,local_5d8);
              uStack_5d4 = local_5d8;
              uStack_5d0 = local_5d8;
              uStack_5cc = local_5d8;
              local_5c8 = local_5d8;
            }
            else {
              local_538 = (long *)(in_RDI + 0xf8);
              local_548 = (undefined8 *)(*local_538 + (long)(local_708 << 2) * 4);
              local_a38 = *local_548;
              uStack_a30 = local_548[1];
            }
            local_768 = (float)local_a38;
            fStack_764 = local_a38._4_4_;
            fStack_760 = (float)uStack_a30;
            fStack_75c = uStack_a30._4_4_;
            local_750.data = local_140;
            local_750.elemsize = local_148;
            local_750.elempack = local_14c;
            local_750.allocator = local_158;
            local_750.w = local_12c;
            local_750.h = local_130;
            local_750.c = local_134;
            if ((local_708 - local_704 < 0) || (local_684 <= local_708 - local_704)) {
              local_4e8 = local_a38;
              uStack_4e0 = uStack_a30;
              local_4d0 = &local_750;
              local_4ec = (int)local_750.cstep * local_134;
              local_4f8 = local_140;
              for (local_4fc = 0; local_200 = local_4d0, local_4fc < local_4ec;
                  local_4fc = local_4fc + 1) {
                local_90 = local_4f8;
                *local_4f8 = local_a38;
                local_4f8[1] = uStack_a30;
                local_4f8 = local_4f8 + 2;
                local_a8 = local_4e8;
                uStack_a0 = uStack_4e0;
              }
            }
            else {
              local_4ac = local_708 - local_704;
              local_4a0 = &local_7c0;
              local_19c = local_660->w;
              local_1a0 = local_660->h;
              local_1a4 = local_660->d;
              local_1b0 = (void *)((long)local_660->data +
                                  local_660->cstep * (long)local_4ac * local_660->elemsize);
              local_1b8 = local_660->elemsize;
              local_1bc = local_660->elempack;
              local_1c8 = local_660->allocator;
              local_198 = &local_7c0;
              local_7b8 = (int *)0x0;
              iVar2 = 1;
              local_b0 = (long)local_19c * (long)(int)in_stack_fffffffffffff870 * local_1b8;
              local_b4 = 0x10;
              local_d4 = 0x10;
              local_4ad = 1;
              local_565 = 1;
              local_7c0 = local_1b0;
              local_7b0 = local_1b8;
              local_7a8 = local_1bc;
              local_7a0 = local_1c8;
              if (*(int *)(in_RDI + 0xe0) == 0) {
                padding_constant_pack4_sse
                          ((Mat *)&local_7c0,&local_750,*(int *)(in_RDI + 0xd0),
                           *(int *)(in_RDI + 0xd4),*(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),
                           (__m128 *)&local_768);
              }
              if (*(int *)(in_RDI + 0xe0) == 1) {
                padding_replicate_pack4_sse
                          ((Mat *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                           (Mat *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                           (int)(in_stack_fffffffffffff498 >> 0x20),(int)in_stack_fffffffffffff498,
                           (int)((ulong)in_stack_fffffffffffff490 >> 0x20),
                           (int)in_stack_fffffffffffff490);
              }
              if (*(int *)(in_RDI + 0xe0) == 2) {
                padding_reflect_pack4_sse
                          (in_stack_fffffffffffff568,in_stack_fffffffffffff560,
                           (int)((ulong)in_stack_fffffffffffff558 >> 0x20),
                           (int)in_stack_fffffffffffff558,
                           (int)((ulong)in_stack_fffffffffffff550 >> 0x20),
                           (int)in_stack_fffffffffffff550);
              }
              local_478 = &local_7c0;
              local_2f0 = local_478;
              if (local_7b8 != (int *)0x0) {
                local_2f4 = 0xffffffff;
                LOCK();
                local_2f8 = *local_7b8;
                *local_7b8 = *local_7b8 + -1;
                UNLOCK();
                if (local_2f8 == 1) {
                  if (local_7a0 == (Allocator *)0x0) {
                    local_270 = local_7c0;
                    if (local_7c0 != (void *)0x0) {
                      free(local_7c0);
                    }
                  }
                  else {
                    (*local_7a0->_vptr_Allocator[3])(local_7a0,local_7c0);
                  }
                }
              }
              local_7c0 = (void *)0x0;
              local_7b0 = 0;
              local_7a8 = 0;
              iVar2 = 0;
              local_7b8 = (int *)0x0;
            }
            local_468 = &local_750;
            local_310 = local_468;
            if (local_750.refcount != (int *)0x0) {
              local_314 = 0xffffffff;
              LOCK();
              local_318 = *local_750.refcount;
              *local_750.refcount = *local_750.refcount + -1;
              UNLOCK();
              if (local_318 == 1) {
                if (local_750.allocator == (Allocator *)0x0) {
                  local_260 = (undefined8 *)local_750.data;
                  if ((undefined8 *)local_750.data != (undefined8 *)0x0) {
                    free(local_750.data);
                  }
                }
                else {
                  (*(local_750.allocator)->_vptr_Allocator[3])(local_750.allocator,local_750.data);
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
    if (local_688 == 4) {
      local_7c4 = local_678 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_7c8 = local_67c + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_7cc = local_680 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (*(int *)(in_RDI + 0xe0) == 0) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                    in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a4,
                    in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff510,
                    in_stack_fffffffffffff518);
        local_618 = local_668;
        bVar5 = true;
        if (local_668->data != (void *)0x0) {
          local_1d8 = local_668;
          bVar5 = local_668->cstep * (long)local_668->c == 0;
        }
        if (!bVar5) {
          for (local_7d0 = 0; local_7d0 < local_684; local_7d0 = local_7d0 + 1) {
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_5f8 = *(undefined4 *)(in_RDI + 0xe4);
              uVar7 = CONCAT44(local_5f8,local_5f8);
              uVar8 = CONCAT44(local_5f8,local_5f8);
              uStack_5f4 = local_5f8;
              uStack_5f0 = local_5f8;
              uStack_5ec = local_5f8;
              local_5e8 = local_5f8;
            }
            else {
              local_540 = (long *)(in_RDI + 0xf8);
              local_550 = (undefined8 *)(*local_540 + (long)(local_7d0 << 2) * 4);
              uVar7 = *local_550;
              uVar8 = local_550[1];
            }
            local_7e8 = (float)uVar7;
            fStack_7e4 = (float)((ulong)uVar7 >> 0x20);
            fStack_7e0 = (float)uVar8;
            fStack_7dc = (float)((ulong)uVar8 >> 0x20);
            for (local_7ec = 0; local_7ec < local_7cc; local_7ec = local_7ec + 1) {
              local_570 = &local_880;
              local_f4 = local_668->w;
              local_f8 = local_668->h;
              local_fc = local_668->d;
              local_108 = (void *)((long)local_668->data +
                                  local_668->cstep * (long)local_7d0 * local_668->elemsize);
              local_110 = local_668->elemsize;
              local_114 = local_668->elempack;
              local_120 = local_668->allocator;
              local_f0 = &local_880;
              local_e0 = (long)local_f4 * (long)local_f8 * local_110;
              local_3f8 = &local_838;
              local_400 = &local_880;
              local_28 = (float *)((long)local_108 +
                                  (long)local_f4 * (long)local_f8 * (long)local_7ec * local_110);
              local_18 = &local_838;
              local_838.cstep = (long)local_f4 * (long)local_f8;
              local_458 = &local_880;
              local_838.c = 1;
              local_838.d = 1;
              local_838.dims = 2;
              local_838.refcount = (int *)0x0;
              local_e4 = 0x10;
              local_404 = local_7ec;
              iStack_57c = local_7d0;
              uStack_57d = 1;
              local_880 = 0;
              local_870 = 0;
              local_868 = 0;
              local_858 = 0;
              local_854 = 0;
              local_850 = 0;
              local_84c = 0;
              local_848 = 0;
              local_840 = 0;
              local_878 = 0;
              local_330 = local_458;
              local_40 = local_120;
              local_34 = local_114;
              local_30 = local_110;
              local_20 = local_f8;
              local_1c = local_f4;
              local_860 = local_120;
              local_838.data = local_28;
              local_838.elemsize = local_110;
              local_838.elempack = local_114;
              local_838.allocator = local_120;
              local_838.w = local_f4;
              local_838.h = local_f8;
              if ((local_7ec - *(int *)(in_RDI + 0xe8) < 0) ||
                 (local_680 <= local_7ec - *(int *)(in_RDI + 0xe8))) {
                local_508 = &local_838;
                local_518 = local_7e8;
                fStack_514 = fStack_7e4;
                fStack_510 = fStack_7e0;
                fStack_50c = fStack_7dc;
                local_51c = (int)local_838.cstep;
                local_528 = local_28;
                for (local_52c = 0; local_1f8 = local_508, local_52c < local_51c;
                    local_52c = local_52c + 1) {
                  local_78 = local_528;
                  local_88 = CONCAT44(fStack_7e4,local_7e8);
                  uStack_80 = CONCAT44(fStack_7dc,fStack_7e0);
                  *local_528 = local_7e8;
                  local_528[1] = fStack_7e4;
                  local_528[2] = fStack_7e0;
                  local_528[3] = fStack_7dc;
                  local_528 = local_528 + 4;
                }
              }
              else {
                local_4b8 = &local_910;
                local_164 = local_660->w;
                local_168 = local_660->h;
                local_16c = local_660->d;
                local_178 = (void *)((long)local_660->data +
                                    local_660->cstep * (long)local_7d0 * local_660->elemsize);
                local_180 = local_660->elemsize;
                local_184 = local_660->elempack;
                local_190 = local_660->allocator;
                local_160 = &local_910;
                local_c0 = (long)local_164 * (long)local_168 * local_180;
                local_3ec = local_7ec - *(int *)(in_RDI + 0xe8);
                local_3e0 = &local_8c8;
                local_3e8 = &local_910;
                local_58 = (void *)((long)local_178 +
                                   (long)local_164 * (long)local_168 * (long)local_3ec * local_180);
                local_48 = &local_8c8;
                local_8c8.cstep = (long)local_164 * (long)local_168;
                local_448 = &local_910;
                local_838.c = 1;
                local_838.d = 1;
                local_838.dims = 2;
                local_838.refcount = (int *)0x0;
                local_848 = 0;
                local_84c = 0;
                local_850 = 0;
                local_854 = 0;
                local_868 = 0;
                local_870 = 0;
                local_878 = 0;
                local_880 = 0;
                local_8c8.c = 1;
                local_8c8.d = 1;
                local_8c8.dims = 2;
                local_8c8.refcount = (int *)0x0;
                local_c4 = 0x10;
                local_e4 = 0x10;
                local_4c4 = local_7d0;
                local_4c5 = 1;
                uStack_57d = 1;
                local_840 = 0;
                local_858 = 0;
                local_910 = 0;
                local_900 = 0;
                local_8f8 = 0;
                local_8e8 = 0;
                local_8e4 = 0;
                local_8e0 = 0;
                local_8dc = 0;
                local_8d8 = 0;
                local_8d0 = 0;
                local_908 = 0;
                local_350 = local_448;
                local_70 = local_190;
                local_64 = local_184;
                local_60 = local_180;
                local_50 = local_168;
                local_4c = local_164;
                local_8f0 = local_190;
                local_8c8.data = local_58;
                local_8c8.elemsize = local_180;
                local_8c8.elempack = local_184;
                local_8c8.allocator = local_190;
                local_8c8.w = local_164;
                local_8c8.h = local_168;
                padding_constant_pack4_sse
                          (&local_8c8,&local_838,*(int *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xd4),
                           *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),(__m128 *)&local_7e8);
                local_438 = &local_8c8;
                local_370 = local_438;
                if (local_8c8.refcount != (int *)0x0) {
                  local_374 = 0xffffffff;
                  LOCK();
                  local_378 = *local_8c8.refcount;
                  *local_8c8.refcount = *local_8c8.refcount + -1;
                  UNLOCK();
                  if (local_378 == 1) {
                    if (local_8c8.allocator == (Allocator *)0x0) {
                      local_230 = local_8c8.data;
                      if (local_8c8.data != (void *)0x0) {
                        free(local_8c8.data);
                      }
                    }
                    else {
                      (*(local_8c8.allocator)->_vptr_Allocator[3])
                                (local_8c8.allocator,local_8c8.data);
                    }
                  }
                }
                local_8c8.data = (void *)0x0;
                local_8c8.elemsize = 0;
                local_8c8.elempack = 0;
                local_8c8.dims = 0;
                local_8c8.w = 0;
                local_8c8.h = 0;
                local_8c8.d = 0;
                local_8c8.c = 0;
                local_8c8.cstep = 0;
                local_8c8.refcount = (int *)0x0;
              }
              local_428 = &local_838;
              local_390 = local_428;
              if (local_838.refcount != (int *)0x0) {
                local_394 = 0xffffffff;
                LOCK();
                local_398 = *local_838.refcount;
                *local_838.refcount = *local_838.refcount + -1;
                UNLOCK();
                if (local_398 == 1) {
                  if (local_838.allocator == (Allocator *)0x0) {
                    local_220 = (float *)local_838.data;
                    if ((float *)local_838.data != (float *)0x0) {
                      free(local_838.data);
                    }
                  }
                  else {
                    (*(local_838.allocator)->_vptr_Allocator[3])(local_838.allocator,local_838.data)
                    ;
                  }
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  local_3d0 = &local_958;
  local_958.data = in_RSI->data;
  local_958.refcount = in_RSI->refcount;
  local_958.elemsize = in_RSI->elemsize;
  local_958.elempack = in_RSI->elempack;
  local_958.allocator = in_RSI->allocator;
  local_958.dims = in_RSI->dims;
  local_958.w = in_RSI->w;
  local_958.h = in_RSI->h;
  local_958.d = in_RSI->d;
  local_958.c = in_RSI->c;
  local_958.cstep = in_RSI->cstep;
  if (local_958.refcount != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_958.refcount;
    *local_958.refcount = *local_958.refcount + 1;
    UNLOCK();
  }
  local_8 = local_3d0;
  if (local_694 != 1) {
    convert_packing(local_3d0,local_3d0,in_stack_fffffffffffff4c4,in_stack_fffffffffffff4b8);
    local_620 = &local_958;
    if (local_958.data != (void *)0x0) {
      local_1d0 = local_620;
    }
    if (local_958.data == (void *)0x0 || local_958.cstep * (long)local_958.c == 0) {
      local_64c = -100;
      goto LAB_0152339a;
    }
  }
  local_64c = Padding::forward(in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                               in_stack_fffffffffffff870,
                               (Option *)
                               CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
LAB_0152339a:
  pMVar6 = &local_958;
  if (local_958.refcount != (int *)0x0) {
    local_3b4 = 0xffffffff;
    LOCK();
    local_3b8 = *local_958.refcount;
    *local_958.refcount = *local_958.refcount + -1;
    UNLOCK();
    if (local_3b8 == 1) {
      local_418 = pMVar6;
      local_3b0 = pMVar6;
      if (local_958.allocator == (Allocator *)0x0) {
        local_210 = local_958.data;
        if (local_958.data != (void *)0x0) {
          free(local_958.data);
        }
      }
      else {
        (*(local_958.allocator)->_vptr_Allocator[3])(local_958.allocator,local_958.data);
      }
    }
  }
  pMVar6->data = (void *)0x0;
  pMVar6->elemsize = 0;
  pMVar6->elempack = 0;
  pMVar6->dims = 0;
  pMVar6->w = 0;
  pMVar6->h = 0;
  pMVar6->d = 0;
  pMVar6->c = 0;
  pMVar6->cstep = 0;
  pMVar6->refcount = (int *)0x0;
  return local_64c;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}